

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.hh
# Opt level: O0

void __thiscall
tinyusdz::tydra::AnimationChannel::AnimationChannel
          (AnimationChannel *this,AnimationChannel *param_1)

{
  AnimationChannel *param_1_local;
  AnimationChannel *this_local;
  
  this->type = param_1->type;
  AnimationSampler<tinyusdz::value::matrix4f>::AnimationSampler
            (&this->transforms,&param_1->transforms);
  AnimationSampler<std::array<float,_3UL>_>::AnimationSampler
            (&this->translations,&param_1->translations);
  AnimationSampler<std::array<float,_4UL>_>::AnimationSampler(&this->rotations,&param_1->rotations);
  AnimationSampler<std::array<float,_3UL>_>::AnimationSampler(&this->scales,&param_1->scales);
  AnimationSampler<float>::AnimationSampler(&this->weights,&param_1->weights);
  return;
}

Assistant:

AnimationChannel() = default;